

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOptions.cpp
# Opt level: O2

uint anon_unknown.dwarf_4d146b::countMipmaps(int w,int h,int d)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (ulong)(uint)d;
  uVar2 = 1;
  while( true ) {
    if (((w == 1) && (h == 1)) && ((int)uVar1 == 1)) break;
    w = w / 2;
    if (w < 2) {
      w = 1;
    }
    h = h / 2;
    if (h < 2) {
      h = 1;
    }
    uVar1 = (long)(int)uVar1 / 2;
    if ((int)uVar1 < 2) {
      uVar1 = 1;
    }
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

static uint countMipmaps(int w, int h, int d)
	{
		uint mipmap = 0;
		
		while (w != 1 || h != 1 || d != 1) {
			w = max(1, w / 2);
			h = max(1, h / 2);
			d = max(1, d / 2);
			mipmap++;
		}
		
		return mipmap + 1;
	}